

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c++
# Opt level: O0

longlong kj::anon_unknown_55::parseSigned(StringPtr *s,longlong min,longlong max)

{
  bool bVar1;
  int *piVar2;
  char *__nptr;
  char *s_00;
  int __base;
  bool local_161;
  Fault local_158;
  Fault f_3;
  DebugComparison<long_long_&,_long_long_&> local_148;
  bool local_119;
  bool _kjCondition_3;
  Fault f_2;
  int *local_108;
  undefined1 local_100 [8];
  DebugComparison<int_&,_int> _kjCondition_2;
  Fault f_1;
  char **local_c8;
  undefined1 local_c0 [8];
  DebugComparison<char_*&,_const_char_*> _kjCondition_1;
  longlong value;
  char *endPtr;
  Fault local_78;
  Fault f;
  StringPtr *local_68;
  undefined1 local_60 [8];
  DebugComparison<const_kj::StringPtr_&,_std::nullptr_t> _kjCondition;
  longlong max_local;
  longlong min_local;
  StringPtr *s_local;
  
  _kjCondition._32_8_ = max;
  max_local = min;
  min_local = (longlong)s;
  local_68 = (StringPtr *)
             kj::_::DebugExpressionStart::operator<<((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,s)
  ;
  f.exception = (Exception *)0x0;
  kj::_::DebugExpression<kj::StringPtr_const&>::operator!=
            ((DebugComparison<const_kj::StringPtr_&,_std::nullptr_t> *)local_60,
             (DebugExpression<kj::StringPtr_const&> *)&local_68,&f.exception);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_60);
  if (bVar1) {
    piVar2 = __errno_location();
    *piVar2 = 0;
    __nptr = StringPtr::begin((StringPtr *)min_local);
    s_00 = StringPtr::cStr((StringPtr *)min_local);
    bVar1 = isHex(s_00);
    __base = 10;
    if (bVar1) {
      __base = 0x10;
    }
    _kjCondition_1._32_8_ = strtoll(__nptr,(char **)&value,__base);
    local_c8 = (char **)kj::_::DebugExpressionStart::operator<<
                                  ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char **)&value);
    f_1.exception = (Exception *)StringPtr::end((StringPtr *)min_local);
    kj::_::DebugExpression<char*&>::operator==
              ((DebugComparison<char_*&,_const_char_*> *)local_c0,
               (DebugExpression<char*&> *)&local_c8,(char **)&f_1);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_c0);
    if (bVar1) {
      piVar2 = __errno_location();
      local_108 = (int *)kj::_::DebugExpressionStart::operator<<
                                   ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,piVar2);
      f_2.exception._4_4_ = 0x22;
      kj::_::DebugExpression<int&>::operator!=
                ((DebugComparison<int_&,_int> *)local_100,(DebugExpression<int&> *)&local_108,
                 (int *)((long)&f_2.exception + 4));
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_100);
      if (bVar1) {
        f_3.exception =
             (Exception *)
             kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                        (longlong *)&_kjCondition_1.result);
        kj::_::DebugExpression<long_long&>::operator>=
                  (&local_148,(DebugExpression<long_long&> *)&f_3,&max_local);
        bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)&local_148);
        local_161 = bVar1 && (long)_kjCondition_1._32_8_ <= (long)_kjCondition._32_8_;
        local_119 = local_161;
        if (bVar1 && (long)_kjCondition_1._32_8_ <= (long)_kjCondition._32_8_) {
          s_local = (StringPtr *)_kjCondition_1._32_8_;
        }
        else {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,bool&,char_const(&)[19],long_long&,long_long&,long_long&>
                    (&local_158,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string.c++"
                     ,0x30,FAILED,"value >= min && value <= max",
                     "_kjCondition,\"Value out-of-range\", value, min, max",&local_119,
                     (char (*) [19])"Value out-of-range",(longlong *)&_kjCondition_1.result,
                     &max_local,(longlong *)&_kjCondition.result);
          s_local = (StringPtr *)0x0;
          kj::_::Debug::Fault::~Fault(&local_158);
        }
      }
      else {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<int&,int>&,char_const(&)[19],kj::StringPtr_const&>
                  ((Fault *)&stack0xfffffffffffffee8,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string.c++"
                   ,0x2f,FAILED,"errno != ERANGE","_kjCondition,\"Value out-of-range\", s",
                   (DebugComparison<int_&,_int> *)local_100,(char (*) [19])"Value out-of-range",
                   (StringPtr *)min_local);
        s_local = (StringPtr *)0x0;
        kj::_::Debug::Fault::~Fault((Fault *)&stack0xfffffffffffffee8);
      }
    }
    else {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<char*&,char_const*>&,char_const(&)[37],kj::StringPtr_const&>
                ((Fault *)&_kjCondition_2.result,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string.c++"
                 ,0x2e,FAILED,"endPtr == s.end()",
                 "_kjCondition,\"String does not contain valid number\", s",
                 (DebugComparison<char_*&,_const_char_*> *)local_c0,
                 (char (*) [37])"String does not contain valid number",(StringPtr *)min_local);
      s_local = (StringPtr *)0x0;
      kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition_2.result);
    }
  }
  else {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<kj::StringPtr_const&,decltype(nullptr)>&,char_const(&)[37],kj::StringPtr_const&>
              (&local_78,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string.c++"
               ,0x2a,FAILED,"s != nullptr",
               "_kjCondition,\"String does not contain valid number\", s",
               (DebugComparison<const_kj::StringPtr_&,_std::nullptr_t> *)local_60,
               (char (*) [37])"String does not contain valid number",(StringPtr *)min_local);
    s_local = (StringPtr *)0x0;
    kj::_::Debug::Fault::~Fault(&local_78);
  }
  return (longlong)s_local;
}

Assistant:

long long parseSigned(const StringPtr& s, long long min, long long max) {
  KJ_REQUIRE(s != nullptr, "String does not contain valid number", s) { return 0; }
  char *endPtr;
  errno = 0;
  auto value = strtoll(s.begin(), &endPtr, isHex(s.cStr()) ? 16 : 10);
  KJ_REQUIRE(endPtr == s.end(), "String does not contain valid number", s) { return 0; }
  KJ_REQUIRE(errno != ERANGE, "Value out-of-range", s) { return 0; }
  KJ_REQUIRE(value >= min && value <= max, "Value out-of-range", value, min, max) { return 0; }
  return value;
}